

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureDataBuffer
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLuint clear_value)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  GLuint component_1;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  GLuint GVar10;
  GLuint component;
  GLuint GVar11;
  int iVar12;
  GLuint local_34;
  
  local_34 = clear_value;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_copy_data_buffer,
             (ulong)(copy_params->m_width * copy_params->m_height * copy_params->m_depth * 4),
             &local_34);
  uVar6 = copy_params->m_zoffset;
  iVar2 = uVar6 * height;
  uVar9 = 0;
  for (uVar3 = uVar6; uVar3 < uVar6 + copy_params->m_depth; uVar3 = uVar3 + 1) {
    uVar6 = copy_params->m_yoffset;
    iVar5 = (uVar6 + iVar2) * width * 4;
    for (uVar7 = uVar6; uVar7 < uVar6 + copy_params->m_height; uVar7 = uVar7 + 1) {
      GVar11 = copy_params->m_xoffset;
      puVar1 = (this->m_copy_data_buffer).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = iVar5 + GVar11 * 4;
      for (GVar10 = GVar11; GVar10 < GVar11 + copy_params->m_width; GVar10 = GVar10 + 1) {
        for (iVar12 = 0; iVar12 != 4; iVar12 = iVar12 + 1) {
          puVar1[uVar9 + iVar12] = iVar8 + iVar12;
        }
        GVar11 = copy_params->m_xoffset;
        iVar8 = iVar8 + 4;
        uVar9 = uVar9 + iVar12;
      }
      uVar6 = copy_params->m_yoffset;
      iVar5 = iVar5 + width * 4;
    }
    uVar6 = copy_params->m_zoffset;
    iVar2 = iVar2 + height;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_expected_data_buffer,(ulong)(height * width * depth * 4),&local_34);
  uVar6 = copy_params->m_zoffset;
  iVar2 = uVar6 * height;
  for (uVar3 = uVar6; uVar3 < uVar6 + copy_params->m_depth; uVar3 = uVar3 + 1) {
    uVar6 = copy_params->m_yoffset;
    iVar5 = (uVar6 + iVar2) * width;
    uVar9 = uVar6;
    for (; uVar6 < uVar9 + copy_params->m_height; uVar6 = uVar6 + 1) {
      GVar11 = copy_params->m_xoffset;
      puVar1 = (this->m_expected_data_buffer).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (GVar11 + iVar5) * 4;
      for (GVar10 = GVar11; GVar10 < GVar11 + copy_params->m_width; GVar10 = GVar10 + 1) {
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          puVar1[(ulong)uVar9 + lVar4] =
               (GVar10 + (uVar6 + uVar3 * height) * width) * 4 | (uint)lVar4;
        }
        GVar11 = copy_params->m_xoffset;
        uVar9 = uVar9 + 4;
      }
      uVar9 = copy_params->m_yoffset;
      iVar5 = iVar5 + width;
    }
    uVar6 = copy_params->m_zoffset;
    iVar2 = iVar2 + height;
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureDataBuffer(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														const SubImage3DCopyParams& copy_params,
														glw::GLuint					clear_value)
{
	glw::GLuint index = 0;

	m_copy_data_buffer.assign(copy_params.m_width * copy_params.m_height * copy_params.m_depth * m_n_components,
							  clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					m_copy_data_buffer[index++] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}

	m_expected_data_buffer.assign(width * height * depth * m_n_components, clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				glw::GLuint* data_pointer =
					&m_expected_data_buffer[(zoffset * width * height + yoffset * width + xoffset) * m_n_components];
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					data_pointer[component] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}
}